

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2;
  ModuleHeaderSyntax *args_3;
  ExternModuleDeclSyntax *pEVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_39;
  Token local_38;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x60),
                      (BumpAllocator *)__child_stack);
  args_3 = (ModuleHeaderSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x98),&local_39,(BumpAllocator *)__child_stack);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::ExternModuleDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ModuleHeaderSyntax&>
                     ((BumpAllocator *)__child_stack,args,&local_38,args_2,args_3);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const ExternModuleDeclSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ExternModuleDeclSyntax>(
        *deepClone(node.attributes, alloc),
        node.externKeyword.deepClone(alloc),
        *deepClone(node.actualAttributes, alloc),
        *deepClone<ModuleHeaderSyntax>(*node.header, alloc)
    );
}